

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::enter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxId *enterId,bool polish)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  DataKey DVar3;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *y;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
  *this_01;
  Real RVar4;
  SPxStatus stat;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_02;
  type_conflict5 tVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  pointer rhs_00;
  double *pdVar11;
  SPxOut *pSVar12;
  _func_int **pp_Var13;
  long lVar14;
  long lVar15;
  undefined7 in_register_00000011;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  DataKey *pDVar16;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar17;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  pointer pnVar18;
  cpp_dec_float<200U,_int,_void> *pcVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar21;
  uint *puVar22;
  type *ptVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  multiprecision *pmVar25;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar26;
  ulong uVar27;
  char cVar28;
  bool bVar29;
  byte bVar30;
  Status enterStat;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1090;
  DataKey *local_1088;
  ulong local_1080;
  SPxId none;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  leavebound;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterTest;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  cpp_dec_float<200U,_int,_void> local_db8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterMax;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterVal;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  objChange;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterLB;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterUB;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  enterRO;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_938;
  cpp_dec_float<200U,_int,_void> local_8b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  multiprecision local_730 [112];
  int local_6c0;
  undefined1 local_6bc;
  fpclass_type local_6b8;
  int32_t iStack_6b4;
  uint local_6b0 [28];
  int local_640;
  undefined1 local_63c;
  fpclass_type local_638;
  int32_t iStack_634;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  uint local_5b0 [28];
  int local_540;
  undefined1 local_53c;
  fpclass_type local_538;
  int32_t iStack_534;
  uint local_530 [28];
  int local_4c0;
  undefined1 local_4bc;
  fpclass_type local_4b8;
  int32_t iStack_4b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0 [2];
  uint local_3b0 [28];
  int local_340;
  undefined1 local_33c;
  fpclass_type local_338;
  int32_t iStack_334;
  multiprecision local_330 [128];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  multiprecision local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t iStack_134;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *rhs;
  
  bVar30 = 0;
  local_1080 = CONCAT44(local_1080._4_4_,(int)CONCAT71(in_register_00000011,polish));
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  enterTest.m_backend.fpclass = cpp_dec_float_finite;
  enterTest.m_backend.prec_elem = 0x1c;
  enterTest.m_backend.data._M_elems[0] = 0;
  enterTest.m_backend.data._M_elems[1] = 0;
  enterTest.m_backend.data._M_elems[2] = 0;
  enterTest.m_backend.data._M_elems[3] = 0;
  enterTest.m_backend.data._M_elems[4] = 0;
  enterTest.m_backend.data._M_elems[5] = 0;
  enterTest.m_backend.data._M_elems[6] = 0;
  enterTest.m_backend.data._M_elems[7] = 0;
  enterTest.m_backend.data._M_elems[8] = 0;
  enterTest.m_backend.data._M_elems[9] = 0;
  enterTest.m_backend.data._M_elems[10] = 0;
  enterTest.m_backend.data._M_elems[0xb] = 0;
  enterTest.m_backend.data._M_elems[0xc] = 0;
  enterTest.m_backend.data._M_elems[0xd] = 0;
  enterTest.m_backend.data._M_elems[0xe] = 0;
  enterTest.m_backend.data._M_elems[0xf] = 0;
  enterTest.m_backend.data._M_elems[0x10] = 0;
  enterTest.m_backend.data._M_elems[0x11] = 0;
  enterTest.m_backend.data._M_elems[0x12] = 0;
  enterTest.m_backend.data._M_elems[0x13] = 0;
  enterTest.m_backend.data._M_elems[0x14] = 0;
  enterTest.m_backend.data._M_elems[0x15] = 0;
  enterTest.m_backend.data._M_elems[0x16] = 0;
  enterTest.m_backend.data._M_elems[0x17] = 0;
  enterTest.m_backend.data._M_elems[0x18] = 0;
  enterTest.m_backend.data._M_elems[0x19] = 0;
  enterTest.m_backend.data._M_elems._104_5_ = 0;
  enterTest.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterTest.m_backend.exp = 0;
  enterTest.m_backend.neg = false;
  enterUB.m_backend.fpclass = cpp_dec_float_finite;
  enterUB.m_backend.prec_elem = 0x1c;
  enterUB.m_backend.data._M_elems[0] = 0;
  enterUB.m_backend.data._M_elems[1] = 0;
  enterUB.m_backend.data._M_elems[2] = 0;
  enterUB.m_backend.data._M_elems[3] = 0;
  enterUB.m_backend.data._M_elems[4] = 0;
  enterUB.m_backend.data._M_elems[5] = 0;
  enterUB.m_backend.data._M_elems[6] = 0;
  enterUB.m_backend.data._M_elems[7] = 0;
  enterUB.m_backend.data._M_elems[8] = 0;
  enterUB.m_backend.data._M_elems[9] = 0;
  enterUB.m_backend.data._M_elems[10] = 0;
  enterUB.m_backend.data._M_elems[0xb] = 0;
  enterUB.m_backend.data._M_elems[0xc] = 0;
  enterUB.m_backend.data._M_elems[0xd] = 0;
  enterUB.m_backend.data._M_elems[0xe] = 0;
  enterUB.m_backend.data._M_elems[0xf] = 0;
  enterUB.m_backend.data._M_elems[0x10] = 0;
  enterUB.m_backend.data._M_elems[0x11] = 0;
  enterUB.m_backend.data._M_elems[0x12] = 0;
  enterUB.m_backend.data._M_elems[0x13] = 0;
  enterUB.m_backend.data._M_elems[0x14] = 0;
  enterUB.m_backend.data._M_elems[0x15] = 0;
  enterUB.m_backend.data._M_elems[0x16] = 0;
  enterUB.m_backend.data._M_elems[0x17] = 0;
  enterUB.m_backend.data._M_elems[0x18] = 0;
  enterUB.m_backend.data._M_elems[0x19] = 0;
  enterUB.m_backend.data._M_elems._104_5_ = 0;
  enterUB.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterUB.m_backend.exp = 0;
  enterUB.m_backend.neg = false;
  enterLB.m_backend.fpclass = cpp_dec_float_finite;
  enterLB.m_backend.prec_elem = 0x1c;
  enterLB.m_backend.data._M_elems[0] = 0;
  enterLB.m_backend.data._M_elems[1] = 0;
  enterLB.m_backend.data._M_elems[2] = 0;
  enterLB.m_backend.data._M_elems[3] = 0;
  enterLB.m_backend.data._M_elems[4] = 0;
  enterLB.m_backend.data._M_elems[5] = 0;
  enterLB.m_backend.data._M_elems[6] = 0;
  enterLB.m_backend.data._M_elems[7] = 0;
  enterLB.m_backend.data._M_elems[8] = 0;
  enterLB.m_backend.data._M_elems[9] = 0;
  enterLB.m_backend.data._M_elems[10] = 0;
  enterLB.m_backend.data._M_elems[0xb] = 0;
  enterLB.m_backend.data._M_elems[0xc] = 0;
  enterLB.m_backend.data._M_elems[0xd] = 0;
  enterLB.m_backend.data._M_elems[0xe] = 0;
  enterLB.m_backend.data._M_elems[0xf] = 0;
  enterLB.m_backend.data._M_elems[0x10] = 0;
  enterLB.m_backend.data._M_elems[0x11] = 0;
  enterLB.m_backend.data._M_elems[0x12] = 0;
  enterLB.m_backend.data._M_elems[0x13] = 0;
  enterLB.m_backend.data._M_elems[0x14] = 0;
  enterLB.m_backend.data._M_elems[0x15] = 0;
  enterLB.m_backend.data._M_elems[0x16] = 0;
  enterLB.m_backend.data._M_elems[0x17] = 0;
  enterLB.m_backend.data._M_elems[0x18] = 0;
  enterLB.m_backend.data._M_elems[0x19] = 0;
  enterLB.m_backend.data._M_elems._104_5_ = 0;
  enterLB.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterLB.m_backend.exp = 0;
  enterLB.m_backend.neg = false;
  enterVal.m_backend.fpclass = cpp_dec_float_finite;
  enterVal.m_backend.prec_elem = 0x1c;
  enterVal.m_backend.data._M_elems[0] = 0;
  enterVal.m_backend.data._M_elems[1] = 0;
  enterVal.m_backend.data._M_elems[2] = 0;
  enterVal.m_backend.data._M_elems[3] = 0;
  enterVal.m_backend.data._M_elems[4] = 0;
  enterVal.m_backend.data._M_elems[5] = 0;
  enterVal.m_backend.data._M_elems[6] = 0;
  enterVal.m_backend.data._M_elems[7] = 0;
  enterVal.m_backend.data._M_elems[8] = 0;
  enterVal.m_backend.data._M_elems[9] = 0;
  enterVal.m_backend.data._M_elems[10] = 0;
  enterVal.m_backend.data._M_elems[0xb] = 0;
  enterVal.m_backend.data._M_elems[0xc] = 0;
  enterVal.m_backend.data._M_elems[0xd] = 0;
  enterVal.m_backend.data._M_elems[0xe] = 0;
  enterVal.m_backend.data._M_elems[0xf] = 0;
  enterVal.m_backend.data._M_elems[0x10] = 0;
  enterVal.m_backend.data._M_elems[0x11] = 0;
  enterVal.m_backend.data._M_elems[0x12] = 0;
  enterVal.m_backend.data._M_elems[0x13] = 0;
  enterVal.m_backend.data._M_elems[0x14] = 0;
  enterVal.m_backend.data._M_elems[0x15] = 0;
  enterVal.m_backend.data._M_elems[0x16] = 0;
  enterVal.m_backend.data._M_elems[0x17] = 0;
  enterVal.m_backend.data._M_elems[0x18] = 0;
  enterVal.m_backend.data._M_elems[0x19] = 0;
  enterVal.m_backend.data._M_elems._104_5_ = 0;
  enterVal.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterVal.m_backend.exp = 0;
  enterVal.m_backend.neg = false;
  enterMax.m_backend.fpclass = cpp_dec_float_finite;
  enterMax.m_backend.prec_elem = 0x1c;
  enterMax.m_backend.data._M_elems[0] = 0;
  enterMax.m_backend.data._M_elems[1] = 0;
  enterMax.m_backend.data._M_elems[2] = 0;
  enterMax.m_backend.data._M_elems[3] = 0;
  enterMax.m_backend.data._M_elems[4] = 0;
  enterMax.m_backend.data._M_elems[5] = 0;
  enterMax.m_backend.data._M_elems[6] = 0;
  enterMax.m_backend.data._M_elems[7] = 0;
  enterMax.m_backend.data._M_elems[8] = 0;
  enterMax.m_backend.data._M_elems[9] = 0;
  enterMax.m_backend.data._M_elems[10] = 0;
  enterMax.m_backend.data._M_elems[0xb] = 0;
  enterMax.m_backend.data._M_elems[0xc] = 0;
  enterMax.m_backend.data._M_elems[0xd] = 0;
  enterMax.m_backend.data._M_elems[0xe] = 0;
  enterMax.m_backend.data._M_elems[0xf] = 0;
  enterMax.m_backend.data._M_elems[0x10] = 0;
  enterMax.m_backend.data._M_elems[0x11] = 0;
  enterMax.m_backend.data._M_elems[0x12] = 0;
  enterMax.m_backend.data._M_elems[0x13] = 0;
  enterMax.m_backend.data._M_elems[0x14] = 0;
  enterMax.m_backend.data._M_elems[0x15] = 0;
  enterMax.m_backend.data._M_elems[0x16] = 0;
  enterMax.m_backend.data._M_elems[0x17] = 0;
  enterMax.m_backend.data._M_elems[0x18] = 0;
  enterMax.m_backend.data._M_elems[0x19] = 0;
  enterMax.m_backend.data._M_elems._104_5_ = 0;
  enterMax.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterMax.m_backend.exp = 0;
  enterMax.m_backend.neg = false;
  local_db8.fpclass = cpp_dec_float_finite;
  local_db8.prec_elem = 0x1c;
  local_db8.data._M_elems[0] = 0;
  local_db8.data._M_elems[1] = 0;
  local_db8.data._M_elems[2] = 0;
  local_db8.data._M_elems[3] = 0;
  local_db8.data._M_elems[4] = 0;
  local_db8.data._M_elems[5] = 0;
  local_db8.data._M_elems[6] = 0;
  local_db8.data._M_elems[7] = 0;
  local_db8.data._M_elems[8] = 0;
  local_db8.data._M_elems[9] = 0;
  local_db8.data._M_elems[10] = 0;
  local_db8.data._M_elems[0xb] = 0;
  local_db8.data._M_elems[0xc] = 0;
  local_db8.data._M_elems[0xd] = 0;
  local_db8.data._M_elems[0xe] = 0;
  local_db8.data._M_elems[0xf] = 0;
  local_db8.data._M_elems[0x10] = 0;
  local_db8.data._M_elems[0x11] = 0;
  local_db8.data._M_elems[0x12] = 0;
  local_db8.data._M_elems[0x13] = 0;
  local_db8.data._M_elems[0x14] = 0;
  local_db8.data._M_elems[0x15] = 0;
  local_db8.data._M_elems[0x16] = 0;
  local_db8.data._M_elems[0x17] = 0;
  local_db8.data._M_elems[0x18] = 0;
  local_db8.data._M_elems[0x19] = 0;
  local_db8.data._M_elems._104_5_ = 0;
  local_db8.data._M_elems[0x1b]._1_3_ = 0;
  local_db8.exp = 0;
  local_db8.neg = false;
  enterRO.m_backend.fpclass = cpp_dec_float_finite;
  enterRO.m_backend.prec_elem = 0x1c;
  enterRO.m_backend.data._M_elems[0] = 0;
  enterRO.m_backend.data._M_elems[1] = 0;
  enterRO.m_backend.data._M_elems[2] = 0;
  enterRO.m_backend.data._M_elems[3] = 0;
  enterRO.m_backend.data._M_elems[4] = 0;
  enterRO.m_backend.data._M_elems[5] = 0;
  enterRO.m_backend.data._M_elems[6] = 0;
  enterRO.m_backend.data._M_elems[7] = 0;
  enterRO.m_backend.data._M_elems[8] = 0;
  enterRO.m_backend.data._M_elems[9] = 0;
  enterRO.m_backend.data._M_elems[10] = 0;
  enterRO.m_backend.data._M_elems[0xb] = 0;
  enterRO.m_backend.data._M_elems[0xc] = 0;
  enterRO.m_backend.data._M_elems[0xd] = 0;
  enterRO.m_backend.data._M_elems[0xe] = 0;
  enterRO.m_backend.data._M_elems[0xf] = 0;
  enterRO.m_backend.data._M_elems[0x10] = 0;
  enterRO.m_backend.data._M_elems[0x11] = 0;
  enterRO.m_backend.data._M_elems[0x12] = 0;
  enterRO.m_backend.data._M_elems[0x13] = 0;
  enterRO.m_backend.data._M_elems[0x14] = 0;
  enterRO.m_backend.data._M_elems[0x15] = 0;
  enterRO.m_backend.data._M_elems[0x16] = 0;
  enterRO.m_backend.data._M_elems[0x17] = 0;
  enterRO.m_backend.data._M_elems[0x18] = 0;
  enterRO.m_backend.data._M_elems[0x19] = 0;
  enterRO.m_backend.data._M_elems._104_5_ = 0;
  enterRO.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  enterRO.m_backend.exp = 0;
  enterRO.m_backend.neg = false;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&objChange);
  iVar9 = (*(this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x7e])(this,enterId);
  uVar27 = local_1080;
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)CONCAT44(extraout_var,iVar9);
  bVar7 = this->instableEnter;
  uVar10 = (uint)local_1080;
  local_1090 = this;
  local_1088 = &enterId->super_DataKey;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&local_db8
             ,&enterStat,&enterRO,&objChange);
  this_02 = local_1090;
  if (uVar10 == 0) {
    epsilon(&leavebound,local_1090);
    pnVar20 = &leavebound;
    pnVar24 = &result;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
      pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    result.m_backend.exp = leavebound.m_backend.exp;
    result.m_backend.neg = leavebound.m_backend.neg;
    result.m_backend.fpclass = leavebound.m_backend.fpclass;
    result.m_backend.prec_elem = leavebound.m_backend.prec_elem;
    if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
        result.m_backend.data._M_elems[0] != 0) {
      result.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
    }
    tVar6 = boost::multiprecision::operator>(&enterTest,&result);
    if (!tVar6) goto LAB_003d74d6;
    DVar3 = *local_1088;
    pnVar20 = &enterTest;
    puVar22 = local_b0;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar22 = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
      puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
    }
    local_40 = enterTest.m_backend.exp;
    local_3c = enterTest.m_backend.neg;
    local_38 = enterTest.m_backend.fpclass;
    iStack_34 = enterTest.m_backend.prec_elem;
    (*(this_02->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x84])(this_02,DVar3,local_b0,(ulong)(uint)enterStat);
    pp_Var13 = (this_02->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
    bVar29 = false;
  }
  else {
LAB_003d74d6:
    pDVar16 = local_1088;
    pUVar17 = this_02->theFvec;
    if (((pUVar17->thedelta).setupStatus == true) && ((pUVar17->thedelta).super_IdxSet.num == 0)) {
      SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::solve4update(&this_02->
                      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,&pUVar17->thedelta,rhs);
    }
    cVar28 = (char)uVar27;
    if ((cVar28 == '\0') && (this_02->m_maxCycle < this_02->m_numCycle)) {
      pnVar20 = &enterMax;
      pnVar24 = &result;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      result.m_backend.exp = enterMax.m_backend.exp;
      result.m_backend.neg = enterMax.m_backend.neg;
      result.m_backend.fpclass = enterMax.m_backend.fpclass;
      result.m_backend.prec_elem = enterMax.m_backend.prec_elem;
      if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
          result.m_backend.data._M_elems[0] != 0) {
        result.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
      }
      leavebound.m_backend.data._M_elems._0_8_ =
           leavebound.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar6 = boost::multiprecision::operator>(&result,(int *)&leavebound);
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[(ulong)tVar6 + 0x89])(this_02);
    }
    pnVar20 = &enterMax;
    pnVar24 = &result;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
      pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    result.m_backend.exp = enterMax.m_backend.exp;
    result.m_backend.neg = enterMax.m_backend.neg;
    result.m_backend.fpclass = enterMax.m_backend.fpclass;
    result.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
       ) {
      result.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    this_02->boundflips = 0;
    pSVar1 = this_02->theratiotester;
    pnVar20 = &enterTest;
    puVar22 = local_130;
    for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
      *puVar22 = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
      puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
    }
    local_c0 = enterTest.m_backend.exp;
    local_bc = enterTest.m_backend.neg;
    local_b8 = enterTest.m_backend.fpclass;
    iStack_b4 = enterTest.m_backend.prec_elem;
    uVar10 = (*pSVar1->_vptr_SPxRatioTester[7])(pSVar1,&result,local_130,(ulong)(uVar10 & 0xff));
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this_02->instableEnterVal).m_backend,0);
    (this_02->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
    this_02->instableEnter = false;
    bVar29 = -1 < (int)uVar10;
    if (bVar29) {
      pnVar20 = &result;
      pmVar25 = local_1b0;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *(uint *)pmVar25 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        pmVar25 = pmVar25 + (ulong)bVar30 * -8 + 4;
      }
      local_140 = result.m_backend.exp;
      local_13c = result.m_backend.neg;
      local_138 = result.m_backend.fpclass;
      iStack_134 = result.m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&leavebound,local_1b0,&result);
      entertol(&result_3,this_02);
      tVar6 = boost::multiprecision::operator<(&leavebound,&result_3);
      uVar27 = (ulong)uVar10;
      if (tVar6) {
        pnVar2 = (this_02->theUBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0x1c;
        pnVar18 = pnVar2 + uVar27;
        pnVar20 = &local_230;
        for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pnVar20->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        local_230.m_backend.exp = pnVar2[uVar27].m_backend.exp;
        local_230.m_backend.neg = pnVar2[uVar27].m_backend.neg;
        local_230.m_backend.fpclass = pnVar2[uVar27].m_backend.fpclass;
        local_230.m_backend.prec_elem = pnVar2[uVar27].m_backend.prec_elem;
        pnVar2 = (this_02->theLBbound).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar18 = pnVar2 + uVar27;
        pnVar20 = &local_2b0;
        for (; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar20->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        local_2b0.m_backend.exp = pnVar2[uVar27].m_backend.exp;
        local_2b0.m_backend.neg = pnVar2[uVar27].m_backend.neg;
        local_2b0.m_backend.fpclass = pnVar2[uVar27].m_backend.fpclass;
        local_2b0.m_backend.prec_elem = pnVar2[uVar27].m_backend.prec_elem;
        RVar4 = Tolerances::epsilon((this_02->
                                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    )._tolerances.
                                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr);
        bVar7 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (&local_230,&local_2b0,RVar4);
        if (((bVar7) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
          this_02->m_numCycle = this_02->m_numCycle + 1;
          this_02->enterCycles = this_02->enterCycles + 1;
        }
      }
      else {
        this_02->m_numCycle = this_02->m_numCycle / 2;
      }
      pSVar26 = this_02->coSolveVector2;
      y = this_02->coSolveVector3;
      this_00 = &this_02->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      x = &this_02->theCoPvec->thedelta;
      rhs_00 = (this_02->unitVecs).data.
               super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar27;
      if (y == (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0) {
        if (pSVar26 ==
            (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   );
        }
        else {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,pSVar26,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this_02->coSolveVector2rhs);
        }
      }
      else {
        if (pSVar26 ==
            (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,y,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this_02->coSolveVector3rhs);
        }
        else {
          SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::coSolve(this_00,x,pSVar26,y,
                    &rhs_00->
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ,this_02->coSolveVector2rhs,this_02->coSolveVector3rhs);
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::operator-=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      *)this_02->theCoPvec,this_02->coSolveVector3);
      }
      local_1090 = (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(local_1090._4_4_,uVar10);
      local_1080 = uVar27;
      if (0 < this_02->boundflips) {
        uVar27 = (ulong)((long)(this_02->coSolveVector3->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this_02->coSolveVector3->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 7 & 0xffffffff;
        while (0 < (int)uVar27) {
          uVar27 = uVar27 - 1;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_330,this_02->coSolveVector3,(int)uVar27);
          boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&leavebound,local_330,arg);
          epsilon(&result_3,this_02);
          tVar6 = boost::multiprecision::operator>(&leavebound,&result_3);
          if (tVar6) {
            pUVar17 = this_02->thePvec;
            SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::operator[](&result_3,this_02->coSolveVector3,(int)uVar27);
            pnVar20 = &result_3;
            ptVar23 = &leavebound;
            for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
              (ptVar23->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
              ptVar23 = (type *)((long)ptVar23 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            leavebound.m_backend.exp = result_3.m_backend.exp;
            leavebound.m_backend.neg = result_3.m_backend.neg;
            leavebound.m_backend.fpclass = result_3.m_backend.fpclass;
            leavebound.m_backend.prec_elem = result_3.m_backend.prec_elem;
            if (result_3.m_backend.fpclass != cpp_dec_float_finite ||
                leavebound.m_backend.data._M_elems[0] != 0) {
              leavebound.m_backend.neg = (bool)(result_3.m_backend.neg ^ 1);
            }
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::
            multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        *)pUVar17,&leavebound,
                       (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)((this_02->thecovectors->set).theitem +
                          (this_02->thecovectors->set).thekey[uVar27 & 0xffffffff].idx));
          }
        }
        if (local_1088->info < 1) {
          pUVar17 = this_02->thePvec;
          SPxRowId::SPxRowId((SPxRowId *)&leavebound,(SPxId *)local_1088);
          pLVar5 = &(this_02->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        else {
          pUVar17 = this_02->theCoPvec;
          SPxColId::SPxColId((SPxColId *)&leavebound,(SPxId *)local_1088);
          pLVar5 = (LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&(this_02->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ;
        }
        iVar9 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                ::number(&(pLVar5->
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).set,(DataKey *)&leavebound);
        pnVar2 = (pUVar17->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar18 = pnVar2 + iVar9;
        pcVar19 = &local_db8;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pcVar19->data)._M_elems[0] = *(uint *)&pnVar18->m_backend;
          pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
          pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar30 * -8 + 4);
        }
        local_db8.exp = pnVar2[iVar9].m_backend.exp;
        local_db8.neg = pnVar2[iVar9].m_backend.neg;
        local_db8.fpclass = pnVar2[iVar9].m_backend.fpclass;
        local_db8.prec_elem = pnVar2[iVar9].m_backend.prec_elem;
        this_02->totalboundflips = this_02->totalboundflips + this_02->boundflips;
      }
      uVar27 = local_1080;
      pnVar2 = (this_02->theCoPrhs->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar19 = &enterRO.m_backend;
      pnVar18 = pnVar2 + local_1080;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar30 * -8 + 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar2[local_1080].m_backend.exp = enterRO.m_backend.exp;
      pnVar2[local_1080].m_backend.neg = enterRO.m_backend.neg;
      pnVar2[local_1080].m_backend.fpclass = enterRO.m_backend.fpclass;
      pnVar2[local_1080].m_backend.prec_elem = enterRO.m_backend.prec_elem;
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 0x1c;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems[6] = 0;
      result_3.m_backend.data._M_elems[7] = 0;
      result_3.m_backend.data._M_elems[8] = 0;
      result_3.m_backend.data._M_elems[9] = 0;
      result_3.m_backend.data._M_elems[10] = 0;
      result_3.m_backend.data._M_elems[0xb] = 0;
      result_3.m_backend.data._M_elems[0xc] = 0;
      result_3.m_backend.data._M_elems[0xd] = 0;
      result_3.m_backend.data._M_elems[0xe] = 0;
      result_3.m_backend.data._M_elems[0xf] = 0;
      result_3.m_backend.data._M_elems[0x10] = 0;
      result_3.m_backend.data._M_elems[0x11] = 0;
      result_3.m_backend.data._M_elems[0x12] = 0;
      result_3.m_backend.data._M_elems[0x13] = 0;
      result_3.m_backend.data._M_elems[0x14] = 0;
      result_3.m_backend.data._M_elems[0x15] = 0;
      result_3.m_backend.data._M_elems[0x16] = 0;
      result_3.m_backend.data._M_elems[0x17] = 0;
      result_3.m_backend.data._M_elems[0x18] = 0;
      result_3.m_backend.data._M_elems[0x19] = 0;
      result_3.m_backend.data._M_elems._104_5_ = 0;
      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_3.m_backend.exp = 0;
      result_3.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_3.m_backend,&enterRO.m_backend,&local_db8);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&result_6.m_backend,&this_02->theFvec->thedelta,(uint)local_1090);
      leavebound.m_backend.fpclass = cpp_dec_float_finite;
      leavebound.m_backend.prec_elem = 0x1c;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0;
      leavebound.m_backend.data._M_elems[2] = 0;
      leavebound.m_backend.data._M_elems[3] = 0;
      leavebound.m_backend.data._M_elems[4] = 0;
      leavebound.m_backend.data._M_elems[5] = 0;
      leavebound.m_backend.data._M_elems[6] = 0;
      leavebound.m_backend.data._M_elems[7] = 0;
      leavebound.m_backend.data._M_elems[8] = 0;
      leavebound.m_backend.data._M_elems[9] = 0;
      leavebound.m_backend.data._M_elems[10] = 0;
      leavebound.m_backend.data._M_elems[0xb] = 0;
      leavebound.m_backend.data._M_elems[0xc] = 0;
      leavebound.m_backend.data._M_elems[0xd] = 0;
      leavebound.m_backend.data._M_elems[0xe] = 0;
      leavebound.m_backend.data._M_elems[0xf] = 0;
      leavebound.m_backend.data._M_elems[0x10] = 0;
      leavebound.m_backend.data._M_elems[0x11] = 0;
      leavebound.m_backend.data._M_elems[0x12] = 0;
      leavebound.m_backend.data._M_elems[0x13] = 0;
      leavebound.m_backend.data._M_elems[0x14] = 0;
      leavebound.m_backend.data._M_elems[0x15] = 0;
      leavebound.m_backend.data._M_elems[0x16] = 0;
      leavebound.m_backend.data._M_elems[0x17] = 0;
      leavebound.m_backend.data._M_elems[0x18] = 0;
      leavebound.m_backend.data._M_elems[0x19] = 0;
      leavebound.m_backend.data._M_elems._104_5_ = 0;
      leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      leavebound.m_backend.exp = 0;
      leavebound.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&leavebound.m_backend,&result_3.m_backend,&result_6.m_backend);
      pUVar17 = this_02->theCoPvec;
      pcVar19 = &leavebound.m_backend;
      pnVar20 = &pUVar17->theval;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar30 * -8 + 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar30 * -8 + 4);
      }
      (pUVar17->theval).m_backend.exp = leavebound.m_backend.exp;
      (pUVar17->theval).m_backend.neg = leavebound.m_backend.neg;
      (pUVar17->theval).m_backend.fpclass = leavebound.m_backend.fpclass;
      (pUVar17->theval).m_backend.prec_elem = leavebound.m_backend.prec_elem;
      pUVar17 = this_02->theCoPvec;
      epsilon(&leavebound,this_02);
      tVar6 = boost::multiprecision::operator>(&pUVar17->theval,&leavebound);
      if (tVar6) {
LAB_003d7efa:
        if (this_02->thePricing == FULL) {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                    (&(this_02->thePvec->theval).m_backend,&(this_02->theCoPvec->theval).m_backend);
          (*(this_02->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x86])(this_02);
        }
        (*(this_02->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x87])(this_02);
      }
      else {
        pUVar17 = this_02->theCoPvec;
        epsilon(&result_6,this_02);
        pnVar20 = &result_6;
        pnVar24 = &result_3;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        result_3.m_backend.exp = result_6.m_backend.exp;
        result_3.m_backend.neg = result_6.m_backend.neg;
        result_3.m_backend.fpclass = result_6.m_backend.fpclass;
        result_3.m_backend.prec_elem = result_6.m_backend.prec_elem;
        if (result_6.m_backend.fpclass != cpp_dec_float_finite ||
            result_3.m_backend.data._M_elems[0] != 0) {
          result_3.m_backend.neg = (bool)(result_6.m_backend.neg ^ 1);
        }
        tVar6 = boost::multiprecision::operator<(&pUVar17->theval,&result_3);
        if (tVar6) goto LAB_003d7efa;
      }
      leavebound.m_backend.fpclass = cpp_dec_float_finite;
      leavebound.m_backend.prec_elem = 0x1c;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0;
      leavebound.m_backend.data._M_elems[2] = 0;
      leavebound.m_backend.data._M_elems[3] = 0;
      leavebound.m_backend.data._M_elems[4] = 0;
      leavebound.m_backend.data._M_elems[5] = 0;
      leavebound.m_backend.data._M_elems[6] = 0;
      leavebound.m_backend.data._M_elems[7] = 0;
      leavebound.m_backend.data._M_elems[8] = 0;
      leavebound.m_backend.data._M_elems[9] = 0;
      leavebound.m_backend.data._M_elems[10] = 0;
      leavebound.m_backend.data._M_elems[0xb] = 0;
      leavebound.m_backend.data._M_elems[0xc] = 0;
      leavebound.m_backend.data._M_elems[0xd] = 0;
      leavebound.m_backend.data._M_elems[0xe] = 0;
      leavebound.m_backend.data._M_elems[0xf] = 0;
      leavebound.m_backend.data._M_elems[0x18] = 0;
      leavebound.m_backend.data._M_elems[0x19] = 0;
      leavebound.m_backend.data._M_elems._104_5_ = 0;
      leavebound.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      leavebound.m_backend.exp = 0;
      leavebound.m_backend.neg = false;
      leavebound.m_backend.data._M_elems[0x10] = 0;
      leavebound.m_backend.data._M_elems[0x11] = 0;
      leavebound.m_backend.data._M_elems[0x12] = 0;
      leavebound.m_backend.data._M_elems[0x13] = 0;
      leavebound.m_backend.data._M_elems[0x14] = 0;
      leavebound.m_backend.data._M_elems[0x15] = 0;
      leavebound.m_backend.data._M_elems[0x16] = 0;
      leavebound.m_backend.data._M_elems[0x17] = 0;
      pnVar20 = &enterMax;
      puVar22 = local_3b0;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar22 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
      }
      local_340 = enterMax.m_backend.exp;
      local_33c = enterMax.m_backend.neg;
      local_338 = enterMax.m_backend.fpclass;
      iStack_334 = enterMax.m_backend.prec_elem;
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x82])
                (this_02,(ulong)local_1090 & 0xffffffff,local_3b0,&leavebound,&objChange);
      pnVar2 = (this_02->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = 0x1c;
      pnVar20 = &enterUB;
      pnVar18 = pnVar2 + uVar27;
      for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar2[uVar27].m_backend.exp = enterUB.m_backend.exp;
      pnVar2[uVar27].m_backend.neg = enterUB.m_backend.neg;
      pnVar2[uVar27].m_backend.fpclass = enterUB.m_backend.fpclass;
      pnVar2[uVar27].m_backend.prec_elem = enterUB.m_backend.prec_elem;
      pnVar2 = (this_02->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar20 = &enterLB;
      pnVar18 = pnVar2 + uVar27;
      for (; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar2[uVar27].m_backend.exp = enterLB.m_backend.exp;
      pnVar2[uVar27].m_backend.neg = enterLB.m_backend.neg;
      pnVar2[uVar27].m_backend.fpclass = enterLB.m_backend.fpclass;
      pnVar2[uVar27].m_backend.prec_elem = enterLB.m_backend.prec_elem;
      updateCoTest(this_02);
      if (this_02->thePricing == FULL) {
        updateTest(this_02);
      }
      pUVar17 = this_02->theFvec;
      lVar14 = 0x1c;
      pcVar19 = &result.m_backend;
      pnVar20 = &pUVar17->theval;
      for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar30 * -8 + 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar30 * -8 + 4);
      }
      (pUVar17->theval).m_backend.exp = result.m_backend.exp;
      (pUVar17->theval).m_backend.neg = result.m_backend.neg;
      (pUVar17->theval).m_backend.fpclass = result.m_backend.fpclass;
      (pUVar17->theval).m_backend.prec_elem = result.m_backend.prec_elem;
      UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::update(this_02->theFvec);
      result_3.m_backend.fpclass = cpp_dec_float_finite;
      result_3.m_backend.prec_elem = 0x1c;
      result_3.m_backend.data._M_elems[0] = 0;
      result_3.m_backend.data._M_elems[1] = 0;
      result_3.m_backend.data._M_elems[2] = 0;
      result_3.m_backend.data._M_elems[3] = 0;
      result_3.m_backend.data._M_elems[4] = 0;
      result_3.m_backend.data._M_elems[5] = 0;
      result_3.m_backend.data._M_elems[6] = 0;
      result_3.m_backend.data._M_elems[7] = 0;
      result_3.m_backend.data._M_elems[8] = 0;
      result_3.m_backend.data._M_elems[9] = 0;
      result_3.m_backend.data._M_elems[10] = 0;
      result_3.m_backend.data._M_elems[0xb] = 0;
      result_3.m_backend.data._M_elems[0xc] = 0;
      result_3.m_backend.data._M_elems[0xd] = 0;
      result_3.m_backend.data._M_elems[0xe] = 0;
      result_3.m_backend.data._M_elems[0xf] = 0;
      result_3.m_backend.data._M_elems[0x10] = 0;
      result_3.m_backend.data._M_elems[0x11] = 0;
      result_3.m_backend.data._M_elems[0x12] = 0;
      result_3.m_backend.data._M_elems[0x13] = 0;
      result_3.m_backend.data._M_elems[0x14] = 0;
      result_3.m_backend.data._M_elems[0x15] = 0;
      result_3.m_backend.data._M_elems[0x16] = 0;
      result_3.m_backend.data._M_elems[0x17] = 0;
      result_3.m_backend.data._M_elems[0x18] = 0;
      result_3.m_backend.data._M_elems[0x19] = 0;
      result_3.m_backend.data._M_elems._104_5_ = 0;
      result_3.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_3.m_backend.exp = 0;
      result_3.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result_3.m_backend,&enterVal.m_backend,&result.m_backend);
      pnVar2 = (this_02->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar19 = &result_3.m_backend;
      pnVar18 = pnVar2 + uVar27;
      for (; lVar14 != 0; lVar14 = lVar14 + -1) {
        *(uint *)&pnVar18->m_backend = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar30 * -8 + 4);
        pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      pnVar2[uVar27].m_backend.exp = result_3.m_backend.exp;
      pnVar2[uVar27].m_backend.neg = result_3.m_backend.neg;
      pnVar2[uVar27].m_backend.fpclass = result_3.m_backend.fpclass;
      pnVar2[uVar27].m_backend.prec_elem = result_3.m_backend.prec_elem;
      epsilon(&result_3,this_02);
      tVar6 = boost::multiprecision::operator>(&leavebound,&result_3);
      if (tVar6) {
        pDVar16 = local_1088;
        uVar10 = (uint)local_1090;
LAB_003d81b7:
        this_01 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)this_02->theFrhs;
        pnVar20 = &leavebound;
        pnVar24 = &result_3;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        result_3.m_backend.exp = leavebound.m_backend.exp;
        result_3.m_backend.neg = leavebound.m_backend.neg;
        result_3.m_backend.fpclass = leavebound.m_backend.fpclass;
        result_3.m_backend.prec_elem = leavebound.m_backend.prec_elem;
        if (leavebound.m_backend.fpclass != cpp_dec_float_finite ||
            result_3.m_backend.data._M_elems[0] != 0) {
          result_3.m_backend.neg = (bool)(leavebound.m_backend.neg ^ 1);
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (this_01,&result_3,
                   (this_02->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).matrix.data[local_1080]);
      }
      else {
        epsilon(&local_938,this_02);
        pDVar16 = local_1088;
        pnVar20 = &local_938;
        pnVar24 = &result_6;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        result_6.m_backend.exp = local_938.m_backend.exp;
        result_6.m_backend.neg = local_938.m_backend.neg;
        result_6.m_backend.fpclass = local_938.m_backend.fpclass;
        result_6.m_backend.prec_elem = local_938.m_backend.prec_elem;
        uVar10 = (uint)local_1090;
        if (local_938.m_backend.fpclass != cpp_dec_float_finite ||
            result_6.m_backend.data._M_elems[0] != 0) {
          result_6.m_backend.neg = (bool)(local_938.m_backend.neg ^ 1);
        }
        tVar6 = boost::multiprecision::operator<(&leavebound,&result_6);
        if (tVar6) goto LAB_003d81b7;
      }
      epsilon(&result_3,this_02);
      tVar6 = boost::multiprecision::operator>(&enterVal,&result_3);
      if (tVar6) {
LAB_003d82a4:
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this_02->theFrhs,&enterVal,rhs);
      }
      else {
        epsilon(&local_938,this_02);
        pnVar20 = &local_938;
        pnVar24 = &result_6;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        result_6.m_backend.exp = local_938.m_backend.exp;
        result_6.m_backend.neg = local_938.m_backend.neg;
        result_6.m_backend.fpclass = local_938.m_backend.fpclass;
        result_6.m_backend.prec_elem = local_938.m_backend.prec_elem;
        if (local_938.m_backend.fpclass != cpp_dec_float_finite ||
            result_6.m_backend.data._M_elems[0] != 0) {
          result_6.m_backend.neg = (bool)(local_938.m_backend.neg ^ 1);
        }
        tVar6 = boost::multiprecision::operator<(&enterVal,&result_6);
        if (tVar6) goto LAB_003d82a4;
      }
      pSVar21 = &objChange;
      pnVar20 = local_4b0;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pSVar21->sum).m_backend.data._M_elems[0];
        pSVar21 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pSVar21 + ((ulong)bVar30 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
      }
      local_4b0[0].m_backend.exp = objChange.sum.m_backend.exp;
      local_4b0[0].m_backend.neg = objChange.sum.m_backend.neg;
      local_4b0[0].m_backend.fpclass = objChange.sum.m_backend.fpclass;
      local_4b0[0].m_backend.prec_elem = objChange.sum.m_backend.prec_elem;
      updateNonbasicValue(this_02,local_4b0);
      pSVar26 = &this_02->theFvec->thedelta;
      pp_Var13 = (this_02->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxBasisBase;
      uVar27 = (ulong)uVar10;
      goto LAB_003d83e7;
    }
    lVar14 = 0x1c;
    pnVar20 = &result;
    pnVar24 = &local_9b8;
    for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
      (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
      pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    local_9b8.m_backend.exp = result.m_backend.exp;
    local_9b8.m_backend.neg = result.m_backend.neg;
    local_9b8.m_backend.fpclass = result.m_backend.fpclass;
    local_9b8.m_backend.prec_elem = result.m_backend.prec_elem;
    pnVar20 = &enterMax;
    pnVar24 = &result_9;
    for (; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
      pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    result_9.m_backend.exp = enterMax.m_backend.exp;
    result_9.m_backend.neg = enterMax.m_backend.neg;
    result_9.m_backend.fpclass = enterMax.m_backend.fpclass;
    result_9.m_backend.prec_elem = enterMax.m_backend.prec_elem;
    if (enterMax.m_backend.fpclass != cpp_dec_float_finite ||
        result_9.m_backend.data._M_elems[0] != 0) {
      result_9.m_backend.neg = (bool)(enterMax.m_backend.neg ^ 1);
    }
    RVar4 = Tolerances::epsilon((this_02->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    bVar8 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_9b8,&result_9,RVar4);
    if (!bVar8) {
      if (cVar28 == '\0') {
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&leavebound.m_backend,*pdVar11,(type *)0x0);
        tVar6 = boost::multiprecision::operator<
                          (&result,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&leavebound.m_backend);
        if (tVar6) {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                    (&result_3.m_backend,-*pdVar11,(type *)0x0);
          tVar6 = boost::multiprecision::operator>
                            (&result,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&result_3.m_backend);
          if (tVar6) {
            (**(this_02->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase)
                      (&this_02->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,0xffffffffffffffff,pDVar16,rhs,0);
            pUVar17 = this_02->theFvec;
            lVar14 = 0x1c;
            pnVar20 = &result;
            pnVar24 = &pUVar17->theval;
            for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
              pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar24 + (ulong)bVar30 * -8 + 4);
            }
            (pUVar17->theval).m_backend.exp = result.m_backend.exp;
            (pUVar17->theval).m_backend.neg = result.m_backend.neg;
            (pUVar17->theval).m_backend.fpclass = result.m_backend.fpclass;
            (pUVar17->theval).m_backend.prec_elem = result.m_backend.prec_elem;
            UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::update(this_02->theFvec);
            DVar3 = *pDVar16;
            pnVar20 = &result;
            puVar22 = local_5b0;
            for (lVar15 = lVar14; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar22 = (pnVar20->m_backend).data._M_elems[0];
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
              puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
            }
            local_540 = result.m_backend.exp;
            local_53c = result.m_backend.neg;
            local_538 = result.m_backend.fpclass;
            iStack_534 = result.m_backend.prec_elem;
            (*(this_02->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x83])
                      (this_02,DVar3,(ulong)(uint)enterStat,local_5b0,rhs,&objChange);
            pSVar21 = &objChange;
            pnVar20 = &local_630;
            for (; lVar14 != 0; lVar14 = lVar14 + -1) {
              (pnVar20->m_backend).data._M_elems[0] = (pSVar21->sum).m_backend.data._M_elems[0];
              pSVar21 = (StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pSVar21 + ((ulong)bVar30 * -2 + 1) * 4);
              pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            local_630.m_backend.exp = objChange.sum.m_backend.exp;
            local_630.m_backend.neg = objChange.sum.m_backend.neg;
            local_630.m_backend.fpclass = objChange.sum.m_backend.fpclass;
            local_630.m_backend.prec_elem = objChange.sum.m_backend.prec_elem;
            updateNonbasicValue(this_02,&local_630);
            return bVar29;
          }
        }
      }
      DVar3 = *pDVar16;
      pnVar20 = &enterTest;
      puVar22 = local_6b0;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar22 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
      }
      local_640 = enterTest.m_backend.exp;
      local_63c = enterTest.m_backend.neg;
      local_638 = enterTest.m_backend.fpclass;
      iStack_634 = enterTest.m_backend.prec_elem;
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this_02,DVar3,local_6b0,(ulong)(uint)enterStat);
      (**(this_02->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         )._vptr_SPxBasisBase)
                (&this_02->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ,0xffffffffffffffff,&none,0,0);
      if (cVar28 != '\0') {
        return bVar29;
      }
      if (1 < (this_02->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).updateCount) {
        pSVar12 = this_02->spxout;
        if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
          leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
          result_3.m_backend.data._M_elems[0] = 5;
          (*pSVar12->_vptr_SPxOut[2])();
          pSVar12 = soplex::operator<<(this_02->spxout,"IENTER01 factorization triggered in ");
          pSVar12 = soplex::operator<<(pSVar12,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
          (*this_02->spxout->_vptr_SPxOut[2])(this_02->spxout,&leavebound);
        }
        (*(this_02->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x75])(this_02);
        return bVar29;
      }
      pnVar20 = &enterTest;
      pmVar25 = local_730;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *(uint *)pmVar25 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        pmVar25 = pmVar25 + (ulong)bVar30 * -8 + 4;
      }
      local_6c0 = enterTest.m_backend.exp;
      local_6bc = enterTest.m_backend.neg;
      local_6b8 = enterTest.m_backend.fpclass;
      iStack_6b4 = enterTest.m_backend.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&leavebound,local_730,&enterTest);
      entertol(&result_3,this_02);
      tVar6 = boost::multiprecision::operator<(&leavebound,&result_3);
      pSVar12 = this_02->spxout;
      if (tVar6) {
        if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
          leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
          result_3.m_backend.data._M_elems[0] = 5;
          (*pSVar12->_vptr_SPxOut[2])();
          pSVar12 = soplex::operator<<(this_02->spxout,
                                       "IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
          (*this_02->spxout->_vptr_SPxOut[2])(this_02->spxout,&leavebound);
        }
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&this_02->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&this_02->theCoPvec->
                    super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,this_02->theCoPrhs);
        computePvec(this_02);
        computeCoTest(this_02);
        computeTest(this_02);
        return bVar29;
      }
      if ((pSVar12 != (SPxOut *)0x0) && (4 < (int)pSVar12->m_verbosity)) {
        leavebound.m_backend.data._M_elems[0] = pSVar12->m_verbosity;
        result_3.m_backend.data._M_elems[0] = 5;
        (*pSVar12->_vptr_SPxOut[2])();
        pSVar12 = soplex::operator<<(this_02->spxout,
                                     "IENTER02 unboundedness/infeasibility found in ");
        pSVar12 = soplex::operator<<(pSVar12,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
        (*this_02->spxout->_vptr_SPxOut[2])(this_02->spxout,&leavebound);
      }
      lVar14 = 0x1c;
      if (this_02->theRep == ROW) {
        pnVar20 = &result;
        pnVar24 = &local_7b0;
        for (; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        local_7b0.m_backend.exp = result.m_backend.exp;
        local_7b0.m_backend.neg = result.m_backend.neg;
        local_7b0.m_backend.fpclass = result.m_backend.fpclass;
        local_7b0.m_backend.prec_elem = result.m_backend.prec_elem;
        computeDualfarkas4Row(this_02,&local_7b0,(SPxId)*local_1088);
        stat = INFEASIBLE;
      }
      else {
        pnVar20 = &result;
        pnVar24 = &local_830;
        for (; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar30 * -2 + 1) * 4);
        }
        local_830.m_backend.exp = result.m_backend.exp;
        local_830.m_backend.neg = result.m_backend.neg;
        local_830.m_backend.fpclass = result.m_backend.fpclass;
        local_830.m_backend.prec_elem = result.m_backend.prec_elem;
        computePrimalray4Col(this_02,&local_830,(SPxId)*local_1088);
        stat = UNBOUNDED;
      }
      setBasisStatus(this_02,stat);
      return bVar29;
    }
    DVar3 = *pDVar16;
    if (bVar7 == false) {
      (this_02->instableEnterId).super_DataKey = DVar3;
      pcVar19 = &enterTest.m_backend;
      pnVar20 = &this_02->instableEnterVal;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pcVar19->data)._M_elems[0];
        pcVar19 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar19 + (ulong)bVar30 * -8 + 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar30 * -8 + 4);
      }
      (this_02->instableEnterVal).m_backend.exp = enterTest.m_backend.exp;
      (this_02->instableEnterVal).m_backend.neg = enterTest.m_backend.neg;
      (this_02->instableEnterVal).m_backend.fpclass = enterTest.m_backend.fpclass;
      (this_02->instableEnterVal).m_backend.prec_elem = enterTest.m_backend.prec_elem;
      DVar3 = *pDVar16;
      leavebound.m_backend.data._M_elems[0] = 0;
      leavebound.m_backend.data._M_elems[1] = 0x40240000;
      local_8b8.fpclass = cpp_dec_float_finite;
      local_8b8.prec_elem = 0x1c;
      local_8b8.data._M_elems[0] = 0;
      local_8b8.data._M_elems[1] = 0;
      local_8b8.data._M_elems[2] = 0;
      local_8b8.data._M_elems[3] = 0;
      local_8b8.data._M_elems[4] = 0;
      local_8b8.data._M_elems[5] = 0;
      local_8b8.data._M_elems[6] = 0;
      local_8b8.data._M_elems[7] = 0;
      local_8b8.data._M_elems[8] = 0;
      local_8b8.data._M_elems[9] = 0;
      local_8b8.data._M_elems[10] = 0;
      local_8b8.data._M_elems[0xb] = 0;
      local_8b8.data._M_elems[0xc] = 0;
      local_8b8.data._M_elems[0xd] = 0;
      local_8b8.data._M_elems[0xe] = 0;
      local_8b8.data._M_elems[0xf] = 0;
      local_8b8.data._M_elems[0x10] = 0;
      local_8b8.data._M_elems[0x11] = 0;
      local_8b8.data._M_elems[0x12] = 0;
      local_8b8.data._M_elems[0x13] = 0;
      local_8b8.data._M_elems[0x14] = 0;
      local_8b8.data._M_elems[0x15] = 0;
      local_8b8.data._M_elems[0x16] = 0;
      local_8b8.data._M_elems[0x17] = 0;
      local_8b8.data._M_elems[0x18] = 0;
      local_8b8.data._M_elems[0x19] = 0;
      local_8b8.data._M_elems._104_5_ = 0;
      local_8b8.data._M_elems[0x1b]._1_3_ = 0;
      local_8b8.exp = 0;
      local_8b8.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
                (&local_8b8,&enterTest.m_backend,(double *)&leavebound);
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this_02,DVar3,&local_8b8,(ulong)(uint)enterStat);
    }
    else {
      pnVar20 = &enterTest;
      puVar22 = local_530;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar22 = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar30 * -2 + 1) * 4);
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
      }
      local_4c0 = enterTest.m_backend.exp;
      local_4bc = enterTest.m_backend.neg;
      local_4b8 = enterTest.m_backend.fpclass;
      iStack_4b4 = enterTest.m_backend.prec_elem;
      (*(this_02->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x84])(this_02,DVar3,local_530,(ulong)(uint)enterStat);
    }
    pp_Var13 = (this_02->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxBasisBase;
  }
  uVar27 = 0xffffffffffffffff;
  pDVar16 = &none.super_DataKey;
  rhs = (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0;
  pSVar26 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
LAB_003d83e7:
  (**pp_Var13)(&this_02->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,uVar27,pDVar16,rhs,pSVar26);
  return bVar29;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}